

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<unsigned_char>_> *
kj::decodeHex(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,
             ArrayPtr<const_char> text)

{
  undefined1 uVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  NullableValue<unsigned_int> *pNVar6;
  uint *puVar7;
  uchar *puVar8;
  Array<unsigned_char> *result_00;
  Range<unsigned_long> RVar9;
  Maybe<unsigned_int> local_a4;
  NullableValue<unsigned_int> local_9c;
  NullableValue<unsigned_int> d2;
  NullableValue<unsigned_int> local_8c;
  NullableValue<unsigned_int> d1;
  byte b;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  bool local_39;
  undefined1 local_38 [7];
  bool hadErrors;
  Array<unsigned_char> result;
  ArrayPtr<const_char> text_local;
  
  result.disposer = (ArrayDisposer *)text.ptr;
  sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&result.disposer);
  heapArray<unsigned_char>((Array<unsigned_char> *)local_38,sVar3 >> 1);
  sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&result.disposer);
  local_39 = (bool)((byte)sVar3 & 1);
  RVar9 = indices<kj::Array<unsigned_char>&>((Array<unsigned_char> *)local_38);
  __begin1.value = RVar9.begin_;
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while( true ) {
    bVar2 = Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i);
    if (!bVar2) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    unique0x00012000 = *puVar4;
    d1._3_1_ = 0;
    pcVar5 = ArrayPtr<const_char>::operator[]
                       ((ArrayPtr<const_char> *)&result.disposer,unique0x00012000 * 2);
    anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d2,*pcVar5);
    pNVar6 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d2);
    _::NullableValue<unsigned_int>::NullableValue(&local_8c,pNVar6);
    Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d2);
    puVar7 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_8c);
    if (puVar7 == (uint *)0x0) {
      local_39 = true;
    }
    else {
      puVar7 = _::NullableValue<unsigned_int>::operator*(&local_8c);
      d1._3_1_ = SUB41(*puVar7 << 4,0);
    }
    _::NullableValue<unsigned_int>::~NullableValue(&local_8c);
    pcVar5 = ArrayPtr<const_char>::operator[]
                       ((ArrayPtr<const_char> *)&result.disposer,stack0xffffffffffffff80 * 2 + 1);
    anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&local_a4,*pcVar5);
    pNVar6 = _::readMaybe<unsigned_int>(&local_a4);
    _::NullableValue<unsigned_int>::NullableValue(&local_9c,pNVar6);
    Maybe<unsigned_int>::~Maybe(&local_a4);
    puVar7 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_9c);
    if (puVar7 == (uint *)0x0) {
      local_39 = true;
    }
    else {
      puVar7 = _::NullableValue<unsigned_int>::operator*(&local_9c);
      d1._3_1_ = d1._3_1_ | (byte)*puVar7;
    }
    _::NullableValue<unsigned_int>::~NullableValue(&local_9c);
    uVar1 = d1._3_1_;
    puVar8 = Array<unsigned_char>::operator[]
                       ((Array<unsigned_char> *)local_38,stack0xffffffffffffff80);
    *puVar8 = uVar1;
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  result_00 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_38);
  EncodingResult<kj::Array<unsigned_char>_>::EncodingResult
            (__return_storage_ptr__,result_00,local_39);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeHex(ArrayPtr<const char> text) {
  auto result = heapArray<byte>(text.size() / 2);
  bool hadErrors = text.size() % 2;

  for (auto i: kj::indices(result)) {
    byte b = 0;
    KJ_IF_MAYBE(d1, tryFromHexDigit(text[i*2])) {
      b = *d1 << 4;
    } else {
      hadErrors = true;
    }
    KJ_IF_MAYBE(d2, tryFromHexDigit(text[i*2+1])) {
      b |= *d2;
    } else {
      hadErrors = true;
    }